

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O0

int voc_count_diff(voccxdef *ctx,objnum *list,uint *flags,int *cnt,int keep_all)

{
  long lVar1;
  objnum oVar2;
  objnum oVar3;
  int *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  objnum sc;
  int dst;
  int j;
  int diff_cnt;
  int i;
  prpnum in_stack_00000160;
  objnum in_stack_00000162;
  prpnum in_stack_00000164;
  objnum in_stack_00000166;
  uchar **in_stack_00000168;
  runcxdef *in_stack_00000170;
  int in_stack_00000180;
  int in_stack_00000188;
  objnum in_stack_00000190;
  int in_stack_ffffffffffffffac;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffb4;
  objnum in_stack_ffffffffffffffbe;
  mcmcxdef *in_stack_ffffffffffffffc0;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  undefined4 local_28;
  
  local_2c = *in_RCX;
  local_28 = 0;
  do {
    if (*in_RCX <= local_28) {
      return local_2c;
    }
    uVar4 = 0;
    runpprop(in_stack_00000170,in_stack_00000168,in_stack_00000166,in_stack_00000164,
             in_stack_00000162,in_stack_00000160,in_stack_00000180,in_stack_00000188,
             in_stack_00000190);
    lVar1 = *(long *)(*(long *)(in_RDI + 0x10) + 0x20);
    *(long *)(*(long *)(in_RDI + 0x10) + 0x20) = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) == '\b') {
      oVar2 = objget1sc(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe);
      if (oVar2 != 0xffff) {
        local_34 = local_28 + 1;
        local_30 = local_28;
        while (local_30 = local_30 + 1, local_30 < *in_RCX) {
          oVar3 = objget1sc(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe);
          if (oVar3 == oVar2) {
            local_2c = local_2c + -1;
            if (in_R8D != 0) {
              *(undefined2 *)(in_RSI + (long)local_34 * 2) =
                   *(undefined2 *)(in_RSI + (long)local_30 * 2);
              *(undefined4 *)(in_RDX + (long)local_34 * 4) =
                   *(undefined4 *)(in_RDX + (long)local_30 * 4);
              local_34 = local_34 + 1;
            }
          }
          else {
            *(undefined2 *)(in_RSI + (long)local_34 * 2) =
                 *(undefined2 *)(in_RSI + (long)local_30 * 2);
            *(undefined4 *)(in_RDX + (long)local_34 * 4) =
                 *(undefined4 *)(in_RDX + (long)local_30 * 4);
            local_34 = local_34 + 1;
          }
        }
        *in_RCX = local_34;
        *(undefined2 *)(in_RSI + (long)local_34 * 2) = 0xffff;
        *(undefined4 *)(in_RDX + (long)local_34 * 4) = 0;
      }
    }
    else if (**(char **)(*(long *)(in_RDI + 0x10) + 0x20) != '\x05') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 0x10) + 0x68) = 0;
      runsign((runcxdef *)CONCAT44(in_stack_ffffffffffffffb4,uVar4),in_stack_ffffffffffffffac);
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

static int voc_count_diff(voccxdef *ctx, objnum *list, uint *flags, int *cnt,
                          int keep_all)
{
    int i;
    int diff_cnt;
    
    /* 
     *   Presume all items will be distinguishable from one another.  As
     *   we scan the list for indistinguishable items, we'll decrement
     *   this count each time we find an item that can't be distinguished
     *   from another item.  
     */
    diff_cnt = *cnt;

    /* 
     *   Look for indistinguishable items.
     *   
     *   An object is distinguishable if it doesn't have the special
     *   property marking it as one of a group of equivalent objects
     *   (PRP_ISEQUIV), or if it has the property but there is no object
     *   following it in the list which has the same immediate superclass.
     *   
     *   Note that we want to keep the duplicates if we're looking for
     *   plurals, because the player is explicitly referring to all
     *   matching objects.  
     */
    for (i = 0 ; i < *cnt ; ++i)
    {
        /* 
         *   check to see if this object might have indistinguishable
         *   duplicates - it must be marked with isEquiv for this to be
         *   possible 
         */
        runppr(ctx->voccxrun, list[i], PRP_ISEQUIV, 0);
        if (runpoplog(ctx->voccxrun))
        {
            int     j;
            int     dst;
            objnum  sc;
            
            /* get the superclass, if possible */
            sc = objget1sc(ctx->voccxmem, list[i]);
            if (sc == MCMONINV)
                continue;
            
            /* 
             *   run through the remainder of the list, and remove any
             *   duplicates of this item 
             */
            for (j = i + 1, dst = i + 1 ; j < *cnt ; ++j)
            {
                /* 
                 *   see if it matches our object - if not, keep it in the
                 *   list by copying it to our destination position 
                 */
                if (objget1sc(ctx->voccxmem, list[j]) != sc)
                {
                    /* it's distinguishable - keep it */
                    list[dst] = list[j];
                    flags[dst++] = flags[j];
                }
                else
                {
                    /*
                     *   This item is indistinguishable from the list[i].
                     *   First, reduce the count of different items.  
                     */
                    --diff_cnt;
                    
                    /*
                     *   Keep this object only if we're keeping all
                     *   redundant indistinguishable items. 
                     */
                    if (keep_all)
                    {
                        /* keep all items -> keep this item */
                        list[dst] = list[j];
                        flags[dst++] = flags[j];
                    }
                }
            }
            
            /* adjust the count to reflect the updated list */
            *cnt = dst;

            /* add a terminator */
            list[dst] = MCMONINV;
            flags[dst] = 0;
        }
    }

    /* return the number of distinguishable items */
    return diff_cnt;
}